

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stablesum.h
# Opt level: O0

void __thiscall soplex::StableSum<double>::operator+=(StableSum<double> *this,double input)

{
  double dVar1;
  double dVar2;
  double y;
  double z;
  double t;
  double input_local;
  StableSum<double> *this_local;
  
  dVar1 = this->sum + input;
  dVar2 = dVar1 - this->sum;
  this->c = (this->sum - (dVar1 - dVar2)) + (input - dVar2) + this->c;
  this->sum = dVar1;
  return;
}

Assistant:

void operator+=(double input)
   {
#ifdef SOPLEX_CHECK_STABLESUM
      checksum += input;
#endif
      double t = sum + input;
      double z = t - sum;
      double y = (sum - (t - z)) + (input - z);
      c += y;

      sum = t;
   }